

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O0

void __thiscall
QAccessibleTextWidget::setSelection
          (QAccessibleTextWidget *this,int selectionIndex,int startOffset,int endOffset)

{
  MoveMode in_ECX;
  MoveMode in_EDX;
  int in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  QTextCursor cursor;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    local_10 = &DAT_aaaaaaaaaaaaaaaa;
    (**(code **)(*in_RDI + 0x158))(&local_10);
    QTextCursor::setPosition((int)&local_10,in_EDX);
    QTextCursor::setPosition((int)&local_10,in_ECX);
    (**(code **)(*in_RDI + 0x160))(in_RDI,&local_10);
    QTextCursor::~QTextCursor((QTextCursor *)&local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAccessibleTextWidget::setSelection(int selectionIndex, int startOffset, int endOffset)
{
    if (selectionIndex != 0)
        return;

    QTextCursor cursor = textCursor();
    cursor.setPosition(startOffset, QTextCursor::MoveAnchor);
    cursor.setPosition(endOffset, QTextCursor::KeepAnchor);
    setTextCursor(cursor);
}